

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

quad<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
           *this,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  uint uVar1;
  int32_t iVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  reference pvVar7;
  default_traits<unsigned_char,_charls::quad<unsigned_char>_> *this_00;
  uchar *puVar8;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  uchar *puVar9;
  uint uVar10;
  array<charls::context_run_mode,_2UL> *this_01;
  size_t in_R8;
  triplet<unsigned_char> local_38;
  triplet<unsigned_char> local_33;
  uint local_30;
  int32_t local_2c;
  int32_t error_value4;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
  *this_local;
  quad<unsigned_char> local_10;
  quad<unsigned_char> rb_local;
  quad<unsigned_char> ra_local;
  
  this_01 = &this->context_run_mode_;
  _error_value2 = this;
  this_local._4_4_ = rb;
  local_10 = ra;
  pvVar7 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  error_value3 = decode_run_interruption_error(this,pvVar7);
  pvVar7 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  error_value4 = decode_run_interruption_error(this,pvVar7);
  pvVar7 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  local_2c = decode_run_interruption_error(this,pvVar7);
  pvVar7 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  local_30 = decode_run_interruption_error(this,pvVar7);
  iVar2 = error_value3;
  puVar8 = (uchar *)(ulong)local_30;
  this_00 = &this->traits_;
  uVar10 = (uint)this_local._4_4_ & 0xff;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar10 - ((uint)local_10 & 0xff)),(uchar *)pvVar7,
                       siglen,puVar8,in_R8);
  puVar9 = (uchar *)(ulong)uVar10;
  bVar3 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,uVar10,iVar2 * iVar6);
  iVar2 = error_value4;
  uVar10 = (uint)this_local._4_4_ >> 8 & 0xff;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar10 - ((uint)local_10 >> 8 & 0xff)),puVar9,
                       siglen_00,puVar8,in_R8);
  puVar9 = (uchar *)(ulong)uVar10;
  bVar4 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,uVar10,iVar2 * iVar6);
  iVar2 = local_2c;
  uVar10 = (uint)this_local._4_4_ >> 0x10 & 0xff;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar10 - ((uint)local_10 >> 0x10 & 0xff)),puVar9,
                       siglen_01,puVar8,in_R8);
  bVar5 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,uVar10,iVar2 * iVar6);
  puVar9 = (uchar *)(ulong)(uint)bVar3;
  puVar8 = (uchar *)(ulong)bVar5;
  triplet<unsigned_char>::triplet(&local_33,(uint)bVar3,(uint)bVar4,(uint)bVar5);
  uVar1 = local_30;
  uVar10 = (uint)this_local._4_4_ >> 0x18;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar10 - ((uint)local_10 >> 0x18)),puVar9,siglen_02,
                       puVar8,in_R8);
  bVar3 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,uVar10,uVar1 * iVar6);
  local_38.field_2.v3 = local_33.field_2.v3;
  local_38.field_0 = local_33.field_0;
  local_38.field_1 = local_33.field_1;
  quad<unsigned_char>::quad(&rb_local,local_38,(uint)bVar3);
  return rb_local;
}

Assistant:

quad<sample_type> decode_run_interruption_pixel(quad<sample_type> ra, quad<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value4{decode_run_interruption_error(context_run_mode_[0])};

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }